

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covariance_matrix_generator.cc
# Opt level: O1

void webrtc::CovarianceMatrixGenerator::PhaseAlignmentMasks
               (size_t frequency_bin,size_t fft_size,int sample_rate,float sound_speed,
               vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
               *geometry,float angle,ComplexMatrix<float> *mat)

{
  float fVar1;
  pointer ppcVar2;
  complex<float> *pcVar3;
  string *result;
  int line;
  ulong uVar4;
  long lVar5;
  float fVar6;
  float fVar7;
  double dVar8;
  double dVar9;
  size_t local_1c8;
  double local_1c0;
  double local_1b8;
  double local_1b0;
  FatalMessage local_1a8;
  
  local_1c8 = CONCAT44(local_1c8._4_4_,1);
  local_1a8._0_8_ = (mat->super_Matrix<std::complex<float>_>).num_rows_;
  if (local_1a8._0_8_ == 1) {
    result = (string *)0x0;
  }
  else {
    result = rtc::MakeCheckOpString<unsigned_int,unsigned_long>
                       ((uint *)&local_1c8,(unsigned_long *)&local_1a8,"1u == mat->num_rows()");
  }
  if (result == (string *)0x0) {
    local_1a8._0_8_ =
         ((long)(geometry->
                super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(geometry->
                super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
                )._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
    local_1c8 = (mat->super_Matrix<std::complex<float>_>).num_columns_;
    if (local_1a8._0_8_ - local_1c8 == 0) {
      result = (string *)0x0;
    }
    else {
      result = rtc::MakeCheckOpString<unsigned_long,unsigned_long>
                         ((unsigned_long *)&local_1a8,&local_1c8,
                          "geometry.size() == mat->num_columns()");
    }
    if (result == (string *)0x0) {
      if ((geometry->
          super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
          )._M_impl.super__Vector_impl_data._M_finish !=
          (geometry->
          super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
          )._M_impl.super__Vector_impl_data._M_start) {
        ppcVar2 = (mat->super_Matrix<std::complex<float>_>).elements_.
                  super__Vector_base<std::complex<float>_*,_std::allocator<std::complex<float>_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        local_1b8 = (double)((float)sample_rate * ((float)frequency_bin / (float)fft_size));
        local_1c0 = (double)sound_speed;
        lVar5 = 0;
        uVar4 = 0;
        do {
          fVar6 = cosf(angle);
          fVar1 = *(float *)((long)((geometry->
                                    super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start)->c + lVar5);
          fVar7 = sinf(angle);
          local_1b0 = (double)(float)(((double)(fVar7 * *(float *)((long)((geometry->
                                                                                                                                                    
                                                  super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->c +
                                                  lVar5 + 4) + fVar6 * fVar1) * -6.283185307179586 *
                                      local_1b8) / local_1c0);
          dVar8 = cos(local_1b0);
          dVar9 = sin(local_1b0);
          pcVar3 = *ppcVar2;
          *(float *)&pcVar3[uVar4]._M_value = (float)dVar8;
          *(float *)((long)&pcVar3[uVar4]._M_value + 4) = (float)dVar9;
          uVar4 = uVar4 + 1;
          lVar5 = lVar5 + 0xc;
        } while (uVar4 < (ulong)(((long)(geometry->
                                        super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
                                        )._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(geometry->
                                        super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start >> 2) *
                                -0x5555555555555555));
      }
      return;
    }
    line = 0x62;
  }
  else {
    line = 0x61;
  }
  rtc::FatalMessage::FatalMessage
            (&local_1a8,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/beamformer/covariance_matrix_generator.cc"
             ,line,result);
  rtc::FatalMessage::~FatalMessage(&local_1a8);
}

Assistant:

void CovarianceMatrixGenerator::PhaseAlignmentMasks(
    size_t frequency_bin,
    size_t fft_size,
    int sample_rate,
    float sound_speed,
    const std::vector<Point>& geometry,
    float angle,
    ComplexMatrix<float>* mat) {
  RTC_CHECK_EQ(1u, mat->num_rows());
  RTC_CHECK_EQ(geometry.size(), mat->num_columns());

  float freq_in_hertz =
      (static_cast<float>(frequency_bin) / fft_size) * sample_rate;

  complex<float>* const* mat_els = mat->elements();
  for (size_t c_ix = 0; c_ix < geometry.size(); ++c_ix) {
    float distance = std::cos(angle) * geometry[c_ix].x() +
                     std::sin(angle) * geometry[c_ix].y();
    float phase_shift = -2.f * M_PI * distance * freq_in_hertz / sound_speed;

    // Euler's formula for mat[0][c_ix] = e^(j * phase_shift).
    mat_els[0][c_ix] = complex<float>(cos(phase_shift), sin(phase_shift));
  }
}